

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.h
# Opt level: O0

bool __thiscall
rlottie::internal::renderer::Polystar::hasChanged(Polystar *this,int prevFrame,int curFrame)

{
  bool bVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int prevFrame_00;
  
  bVar1 = internal::model::Property<VPointF,_void>::changed
                    ((Property<VPointF,_void> *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
                     in_stack_ffffffffffffffe8);
  prevFrame_00 = CONCAT13(1,(int3)in_stack_ffffffffffffffec);
  if (!bVar1) {
    bVar1 = internal::model::Property<float,_void>::changed
                      ((Property<float,_void> *)CONCAT44(in_ESI,in_EDX),prevFrame_00,
                       in_stack_ffffffffffffffe8);
    prevFrame_00 = CONCAT13(1,(int3)prevFrame_00);
    if (!bVar1) {
      bVar1 = internal::model::Property<float,_void>::changed
                        ((Property<float,_void> *)CONCAT44(in_ESI,in_EDX),prevFrame_00,
                         in_stack_ffffffffffffffe8);
      prevFrame_00 = CONCAT13(1,(int3)prevFrame_00);
      if (!bVar1) {
        bVar1 = internal::model::Property<float,_void>::changed
                          ((Property<float,_void> *)CONCAT44(in_ESI,in_EDX),prevFrame_00,
                           in_stack_ffffffffffffffe8);
        prevFrame_00 = CONCAT13(1,(int3)prevFrame_00);
        if (!bVar1) {
          bVar1 = internal::model::Property<float,_void>::changed
                            ((Property<float,_void> *)CONCAT44(in_ESI,in_EDX),prevFrame_00,
                             in_stack_ffffffffffffffe8);
          prevFrame_00 = CONCAT13(1,(int3)prevFrame_00);
          if (!bVar1) {
            bVar1 = internal::model::Property<float,_void>::changed
                              ((Property<float,_void> *)CONCAT44(in_ESI,in_EDX),prevFrame_00,
                               in_stack_ffffffffffffffe8);
            prevFrame_00 = CONCAT13(1,(int3)prevFrame_00);
            if (!bVar1) {
              bVar1 = internal::model::Property<float,_void>::changed
                                ((Property<float,_void> *)CONCAT44(in_ESI,in_EDX),prevFrame_00,
                                 in_stack_ffffffffffffffe8);
              prevFrame_00 = (uint)bVar1 << 0x18;
            }
          }
        }
      }
    }
  }
  return SUB41((uint)prevFrame_00 >> 0x18,0);
}

Assistant:

bool hasChanged(int prevFrame, int curFrame) final
    {
        return (mData->mPos.changed(prevFrame, curFrame) ||
                mData->mPointCount.changed(prevFrame, curFrame) ||
                mData->mInnerRadius.changed(prevFrame, curFrame) ||
                mData->mOuterRadius.changed(prevFrame, curFrame) ||
                mData->mInnerRoundness.changed(prevFrame, curFrame) ||
                mData->mOuterRoundness.changed(prevFrame, curFrame) ||
                mData->mRotation.changed(prevFrame, curFrame));
    }